

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O2

iterator __thiscall
QHash<QString,QMap<ProKey,ProStringList>>::emplace_helper<QMap<ProKey,ProStringList>>
          (QHash<QString,QMap<ProKey,ProStringList>> *this,QString *key,
          QMap<ProKey,_ProStringList> *args)

{
  piter pVar1;
  Node<QString,_QMap<ProKey,_ProStringList>_> *n;
  long in_FS_OFFSET;
  InsertionResult local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_38.initialized = true;
  local_38._17_7_ = 0xaaaaaaaaaaaaaa;
  local_38.it.d =
       (Data<QHashPrivate::Node<QString,_QMap<ProKey,_ProStringList>_>_> *)0xaaaaaaaaaaaaaaaa;
  local_38.it.bucket = 0xaaaaaaaaaaaaaaaa;
  QHashPrivate::Data<QHashPrivate::Node<QString,_QMap<ProKey,_ProStringList>_>_>::
  findOrInsert<QString>
            (&local_38,*(Data<QHashPrivate::Node<QString,_QMap<ProKey,_ProStringList>_>_> **)this,
             key);
  n = (Node<QString,_QMap<ProKey,_ProStringList>_> *)
      ((local_38.it.d)->spans[local_38.it.bucket >> 7].entries +
      (local_38.it.d)->spans[local_38.it.bucket >> 7].offsets[(uint)local_38.it.bucket & 0x7f]);
  if (local_38.initialized == false) {
    QHashPrivate::Node<QString,QMap<ProKey,ProStringList>>::
    createInPlace<QMap<ProKey,ProStringList>>(n,key,args);
  }
  else {
    QHashPrivate::Node<QString,QMap<ProKey,ProStringList>>::emplaceValue<QMap<ProKey,ProStringList>>
              ((Node<QString,QMap<ProKey,ProStringList>> *)n,args);
  }
  pVar1.bucket = local_38.it.bucket;
  pVar1.d = local_38.it.d;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return (iterator)pVar1;
  }
  __stack_chk_fail();
}

Assistant:

iterator emplace_helper(Key &&key, Args &&... args)
    {
        auto result = d->findOrInsert(key);
        if (!result.initialized)
            Node::createInPlace(result.it.node(), std::move(key), std::forward<Args>(args)...);
        else
            result.it.node()->emplaceValue(std::forward<Args>(args)...);
        return iterator(result.it);
    }